

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O2

void Wln_RetMarkChanges(Wln_Ret_t *p,Vec_Int_t *vFront)

{
  int iVar1;
  int iVar2;
  
  if (vFront == (Vec_Int_t *)0x0) {
    Vec_IntFill(&p->vPathDelays,(p->pNtk->vTypes).nSize,-1);
    for (iVar2 = 0; iVar2 < (p->pNtk->vCis).nSize; iVar2 = iVar2 + 1) {
      iVar1 = Vec_IntEntry(&p->pNtk->vCis,iVar2);
      Vec_IntWriteEntry(&p->vPathDelays,iVar1,0);
    }
  }
  else {
    for (iVar2 = 0; iVar2 < vFront->nSize; iVar2 = iVar2 + 1) {
      iVar1 = Vec_IntEntry(vFront,iVar2);
      Wln_RetMarkChanges_rec(p,iVar1);
    }
  }
  return;
}

Assistant:

void Wln_RetMarkChanges( Wln_Ret_t * p, Vec_Int_t * vFront )
{
    int i, iObj;
    if ( vFront )
    {
        Vec_IntForEachEntry( vFront, iObj, i )
            Wln_RetMarkChanges_rec( p, iObj );
    }
    else
    {
        Vec_IntFill( &p->vPathDelays, Wln_NtkObjNum(p->pNtk), -1 );
        Wln_NtkForEachCi( p->pNtk, iObj, i )
            Vec_IntWriteEntry( &p->vPathDelays, iObj, 0 );
    }
}